

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O0

size_t ZopfliIterate(size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
                    BrotliEncoderParams *params,size_t gap,int *dist_cache,ZopfliCostModel *model,
                    uint32_t *num_matches,BackwardMatch *matches,ZopfliNode *nodes)

{
  int iVar1;
  size_t max_backward_limit_00;
  size_t pos;
  ulong uVar2;
  size_t sVar3;
  ulong local_1c8;
  ulong local_1c0;
  size_t skip;
  size_t i;
  size_t cur_match_pos;
  StartPosQueue queue;
  size_t max_zopfli_len;
  size_t max_backward_limit;
  size_t stream_offset;
  size_t gap_local;
  BrotliEncoderParams *params_local;
  size_t ringbuffer_mask_local;
  uint8_t *ringbuffer_local;
  size_t position_local;
  size_t num_bytes_local;
  
  sVar3 = params->stream_offset;
  max_backward_limit_00 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  iVar1 = 0x145;
  if (params->quality < 0xb) {
    iVar1 = 0x96;
  }
  queue.idx_ = (size_t)iVar1;
  i = 0;
  nodes->length = 0;
  (nodes->u).cost = 0.0;
  queue.q_[7].costdiff = 0.0;
  queue.q_[7].cost = 0.0;
  for (skip = 0; skip + 3 < num_bytes; skip = skip + 1) {
    local_1c0 = UpdateNodes(num_bytes,position,skip,ringbuffer,ringbuffer_mask,params,
                            max_backward_limit_00,dist_cache,(ulong)num_matches[skip],matches + i,
                            model,(StartPosQueue *)&cur_match_pos,nodes);
    if (local_1c0 < 0x4000) {
      local_1c0 = 0;
    }
    i = num_matches[skip] + i;
    if ((num_matches[skip] == 1) && (queue.idx_ < matches[i - 1].length_and_code >> 5)) {
      local_1c8 = (ulong)(matches[i - 1].length_and_code >> 5);
      if (local_1c8 <= local_1c0) {
        local_1c8 = local_1c0;
      }
      local_1c0 = local_1c8;
    }
    if (1 < local_1c0) {
      while ((local_1c0 = local_1c0 - 1, local_1c0 != 0 &&
             (pos = skip + 1, uVar2 = skip + 4, skip = pos, uVar2 < num_bytes))) {
        EvaluateNode(position + sVar3,pos,max_backward_limit_00,gap,dist_cache,model,
                     (StartPosQueue *)&cur_match_pos,nodes);
        i = num_matches[pos] + i;
      }
    }
  }
  sVar3 = ComputeShortestPathFromNodes(num_bytes,nodes);
  return sVar3;
}

Assistant:

static size_t ZopfliIterate(size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    const BrotliEncoderParams* params, const size_t gap, const int* dist_cache,
    const ZopfliCostModel* model, const uint32_t* num_matches,
    const BackwardMatch* matches, ZopfliNode* nodes) {
  const size_t stream_offset = params->stream_offset;
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t max_zopfli_len = MaxZopfliLen(params);
  StartPosQueue queue;
  size_t cur_match_pos = 0;
  size_t i;
  nodes[0].length = 0;
  nodes[0].u.cost = 0;
  InitStartPosQueue(&queue);
  for (i = 0; i + 3 < num_bytes; i++) {
    size_t skip = UpdateNodes(num_bytes, position, i, ringbuffer,
        ringbuffer_mask, params, max_backward_limit, dist_cache,
        num_matches[i], &matches[cur_match_pos], model, &queue, nodes);
    if (skip < BROTLI_LONG_COPY_QUICK_STEP) skip = 0;
    cur_match_pos += num_matches[i];
    if (num_matches[i] == 1 &&
        BackwardMatchLength(&matches[cur_match_pos - 1]) > max_zopfli_len) {
      skip = BROTLI_MAX(size_t,
          BackwardMatchLength(&matches[cur_match_pos - 1]), skip);
    }
    if (skip > 1) {
      skip--;
      while (skip) {
        i++;
        if (i + 3 >= num_bytes) break;
        EvaluateNode(position + stream_offset, i, max_backward_limit, gap,
            dist_cache, model, &queue, nodes);
        cur_match_pos += num_matches[i];
        skip--;
      }
    }
  }
  return ComputeShortestPathFromNodes(num_bytes, nodes);
}